

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

int mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::del_attr
              (MPI_Datatype param_1,int param_2,void *attribute_val,void *param_4)

{
  void *param_3_local;
  void *attribute_val_local;
  int param_1_local;
  MPI_Datatype param_0_local;
  
  if (attribute_val != (void *)0x0) {
    std::function<void_(void_*,_void_*,_int_*)>::~function
              ((function<void_(void_*,_void_*,_int_*)> *)attribute_val);
    operator_delete(attribute_val);
  }
  return 0;
}

Assistant:

static int del_attr(MPI_Datatype, int, void *attribute_val, void *) {
        delete (T*)attribute_val;
        return MPI_SUCCESS;
    }